

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_generate.cpp
# Opt level: O3

compile_errcode __thiscall VariableDefinition::Generate(VariableDefinition *this)

{
  int iVar1;
  pointer pSVar2;
  bool bVar3;
  SymbolName SVar4;
  uint uVar5;
  string local_50;
  
  uVar5 = 0;
  do {
    SVar4 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (uVar5 < 0xe) {
      pSVar2 = (handle_correct_queue->m_symbol_queue).
               super__Vector_base<Symbol,_std::allocator<Symbol>_>._M_impl.super__Vector_impl_data.
               _M_start;
      switch(uVar5) {
      case 0:
        if ((SVar4 & ~SWITCH_SYM) != INT_SYM) {
          return -1;
        }
        this->m_type = SVar4;
LAB_00149a00:
        uVar5 = 1;
        break;
      case 1:
        if (SVar4 != IDENTIFIER_SYM) {
          return -1;
        }
        c0_compile::SymbolValue::GetValue<std::__cxx11::string>
                  (&local_50,&pSVar2[handle_correct_queue->m_current_locate].m_value);
        std::__cxx11::string::operator=((string *)&this->m_identifier_name,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        bVar3 = SymbolTableTree::FindTerm(symbol_table_tree,&this->m_identifier_name,true);
        if (bVar3) {
          this->m_valid = false;
        }
        else {
          this->m_valid = true;
        }
        uVar5 = 2;
        break;
      case 2:
        if (SVar4 != L_SQUARE_BRACKET_SYM) {
          if (SVar4 == SEMICOLON_SYM) goto LAB_00149aa8;
          if (SVar4 != COMMA_SYM) {
            return -1;
          }
          goto LAB_00149a00;
        }
        uVar5 = 0xb;
        break;
      case 3:
        return 0;
      case 0xb:
        if (SVar4 != INTERGER_SYM) {
          return -1;
        }
        iVar1 = pSVar2[handle_correct_queue->m_current_locate].m_value.value.int_value;
        this->m_array_length = iVar1;
        uVar5 = 0xc;
        if (iVar1 < 1) {
          this->m_valid = false;
        }
        break;
      case 0xc:
        uVar5 = 0xd;
        if (SVar4 != R_SQUARE_BRACKET_SYM) {
          return -1;
        }
        break;
      case 0xd:
        uVar5 = 1;
        if (SVar4 != COMMA_SYM) {
          if (SVar4 != SEMICOLON_SYM) {
            return -1;
          }
LAB_00149aa8:
          uVar5 = 3;
        }
      }
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
}

Assistant:

compile_errcode VariableDefinition::Generate() {
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        int line_number = handle_correct_queue->GetCurrentLine();
        int character_number = handle_correct_queue->GetCurrentCharacter();
        switch (state) {
            case 0: {
                if (IsValidVariableType(name)) {
                    state = 1;
                    m_type = name;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == IDENTIFIER_SYM) {
                    state = 2;
                    m_identifier_name = handle_correct_queue->GetCurrentValue<string>();
                    if (symbol_table_tree->FindTerm(m_identifier_name, true)) {
                        m_valid = false;
                    } else {
                        m_valid = true;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == L_SQUARE_BRACKET_SYM) {
                    state = 11;
                    break;
                } else if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: return COMPILE_OK;
            case 11: {
                if (name == INTERGER_SYM) {
                    state = 12;
                    m_array_length = handle_correct_queue->GetCurrentValue<int>();
                    if (m_array_length <= 0) {
                        m_valid = false;
                    }
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 12: {
                if (name == R_SQUARE_BRACKET_SYM) {
                    state = 13;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 13: {
                if (name == COMMA_SYM) {
                    state = 1;
                    break;
                } else if (name == SEMICOLON_SYM) {
                    state = 3;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}